

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyConnectivity.cc
# Opt level: O0

void __thiscall
OpenMesh::PolyConnectivity::split_edge_copy(PolyConnectivity *this,EdgeHandle _eh,VertexHandle _vh)

{
  HalfedgeHandle HVar1;
  EdgeHandle _eh_to;
  EdgeHandle eh0;
  PolyConnectivity *this_local;
  VertexHandle _vh_local;
  EdgeHandle _eh_local;
  
  split_edge(this,_eh,_vh);
  HVar1 = ArrayKernel::halfedge_handle(&this->super_ArrayKernel,_eh,1);
  HVar1 = ArrayKernel::next_halfedge_handle(&this->super_ArrayKernel,HVar1);
  _eh_to = ArrayKernel::edge_handle(&this->super_ArrayKernel,HVar1);
  BaseKernel::copy_all_properties
            ((BaseKernel *)this,(EdgeHandle)_eh.super_BaseHandle.idx_,
             (EdgeHandle)_eh_to.super_BaseHandle.idx_,false);
  return;
}

Assistant:

void PolyConnectivity::split_edge_copy(EdgeHandle _eh, VertexHandle _vh)
{
  // Split the edge (handle is kept!)
  split_edge(_eh, _vh);

  // Navigate to the new edge
  EdgeHandle eh0 = edge_handle( next_halfedge_handle( halfedge_handle(_eh, 1) ) );

  // Copy the property from the original to the new edge
  copy_all_properties(_eh, eh0);
}